

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  undefined1 *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  uint *puVar3;
  double dVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  int *idx;
  int *idx_00;
  pointer pBVar7;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  Item *pIVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pBVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  BreakpointSource BVar18;
  BreakpointSource BVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  bool bVar22;
  fpclass_type fVar23;
  int32_t iVar24;
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  DataKey DVar29;
  undefined8 uVar30;
  uint uVar28;
  long lVar33;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar34;
  undefined8 uVar35;
  uint *puVar36;
  cpp_dec_float<100U,_int,_void> *pcVar37;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar38;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar39;
  pointer pnVar40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar41;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar42;
  cpp_dec_float<100U,_int,_void> *pcVar43;
  long lVar44;
  int iVar45;
  bool bVar46;
  ulong uVar47;
  pointer pnVar48;
  pointer pnVar49;
  pointer pnVar50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar51;
  uint local_910;
  int nBp;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  uint local_89c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int minIdx;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808 [3];
  undefined3 uStack_7fb;
  int iStack_7f8;
  bool bStack_7f4;
  undefined8 local_7f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7e8;
  pointer local_7e0;
  pointer local_7d8;
  pointer local_7d0;
  pointer local_7c8;
  SPxId enterId;
  cpp_dec_float<100U,_int,_void> local_7b8;
  pointer local_768;
  pointer local_760;
  pointer local_758;
  pointer local_750;
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  uint local_718 [3];
  undefined3 uStack_70b;
  int iStack_708;
  bool bStack_704;
  undefined8 local_700;
  cpp_dec_float<100U,_int,_void> *local_6f0;
  cpp_dec_float<100U,_int,_void> local_6e8;
  cpp_dec_float<100U,_int,_void> local_698;
  cpp_dec_float<100U,_int,_void> *local_648;
  BreakpointCompare compare;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  cpp_dec_float<100U,_int,_void> local_5a8;
  long local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  uint local_4e8 [2];
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  uint local_4a8 [2];
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint local_278 [2];
  undefined8 uStack_270;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  undefined8 uVar31;
  undefined8 uVar32;
  
  iVar26 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->leaveCount;
  if ((iVar26 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar26 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x174,1);
  }
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x171 != '\x01' || polish) ||
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep == ROW)) goto LAB_0049088b;
  this_00 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).field_0x174;
  if (*(int *)&this->field_0x1bc != 2) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       ((cpp_dec_float<100U,_int,_void> *)this_00,&lowstab.m_backend);
    if (iVar26 < 1) goto LAB_0049088b;
  }
  pSVar5 = (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver;
  pUVar39 = pSVar5->theCoPvec;
  pUVar6 = pSVar5->thePvec;
  local_760 = (pUVar6->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_7d0 = (pUVar6->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar6->thedelta).super_IdxSet.idx;
  iVar26 = (pUVar6->thedelta).super_IdxSet.num;
  local_7e0 = (pSVar5->theLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_768 = (pSVar5->theUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_750 = (pUVar39->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_7c8 = (pUVar39->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx_00 = (pUVar39->thedelta).super_IdxSet.idx;
  local_7e8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT44(local_7e8._4_4_,(pUVar39->thedelta).super_IdxSet.num);
  local_7d8 = (pSVar5->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_758 = (pSVar5->theCoUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 0x10;
  local_6e8.data._M_elems[0] = 0;
  local_6e8.data._M_elems[1] = 0;
  local_6e8.data._M_elems[2] = 0;
  local_6e8.data._M_elems[3] = 0;
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems[6] = 0;
  local_6e8.data._M_elems[7] = 0;
  local_6e8.data._M_elems[8] = 0;
  local_6e8.data._M_elems[9] = 0;
  local_6e8.data._M_elems[10] = 0;
  local_6e8.data._M_elems[0xb] = 0;
  local_6e8.data._M_elems[0xc] = 0;
  local_6e8.data._M_elems[0xd] = 0;
  local_6e8.data._M_elems._56_5_ = 0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_6e8.data._M_elems[0xf]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  local_5a8.fpclass = cpp_dec_float_finite;
  local_5a8.prec_elem = 0x10;
  local_5a8.data._M_elems[0] = 0;
  local_5a8.data._M_elems[1] = 0;
  local_5a8.data._M_elems[2] = 0;
  local_5a8.data._M_elems[3] = 0;
  local_5a8.data._M_elems[4] = 0;
  local_5a8.data._M_elems[5] = 0;
  local_5a8.data._M_elems[6] = 0;
  local_5a8.data._M_elems[7] = 0;
  local_5a8.data._M_elems[8] = 0;
  local_5a8.data._M_elems[9] = 0;
  local_5a8.data._M_elems[10] = 0;
  local_5a8.data._M_elems[0xb] = 0;
  local_5a8.data._M_elems[0xc] = 0;
  local_5a8.data._M_elems[0xd] = 0;
  local_5a8.data._M_elems._56_5_ = 0;
  local_5a8.data._M_elems[0xf]._1_3_ = 0;
  local_5a8.exp = 0;
  local_5a8.neg = false;
  local_698.fpclass = cpp_dec_float_finite;
  local_698.prec_elem = 0x10;
  local_698.data._M_elems[0] = 0;
  local_698.data._M_elems[1] = 0;
  local_698.data._M_elems[2] = 0;
  local_698.data._M_elems[3] = 0;
  local_698.data._M_elems[4] = 0;
  local_698.data._M_elems[5] = 0;
  local_698.data._M_elems[6] = 0;
  local_698.data._M_elems[7] = 0;
  local_698.data._M_elems[8] = 0;
  local_698.data._M_elems[9] = 0;
  local_698.data._M_elems[10] = 0;
  local_698.data._M_elems[0xb] = 0;
  local_698.data._M_elems[0xc] = 0;
  local_698.data._M_elems[0xd] = 0;
  local_698.data._M_elems._56_5_ = 0;
  local_698.data._M_elems[0xf]._1_3_ = 0;
  local_698.exp = 0;
  local_698.neg = false;
  local_7b8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_7b8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_7b8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_7b8.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_7b8.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_7b8.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_7b8.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  local_7b8.data._M_elems._56_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_7b8.exp = (val->m_backend).exp;
  local_7b8.neg = (val->m_backend).neg;
  local_7b8.fpclass = (val->m_backend).fpclass;
  local_7b8.prec_elem = (val->m_backend).prec_elem;
  local_6f0 = (cpp_dec_float<100U,_int,_void> *)this_00;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_6e8,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_7b8.fpclass == cpp_dec_float_NaN) {
LAB_004908a2:
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar26,local_7d0,local_760,local_768,local_7e0,PVEC)
    ;
    collectBreakpointsMin
              (this,&nBp,&minIdx,idx_00,(int)local_7e8,local_7c8,local_750,local_758,local_7d8,
               COPVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_7b8,&lowstab.m_backend);
    if (iVar27 < 1) goto LAB_004908a2;
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar26,local_7d0,local_760,local_768,local_7e0,PVEC)
    ;
    collectBreakpointsMax
              (this,&nBp,&minIdx,idx_00,(int)local_7e8,local_7c8,local_750,local_758,local_7d8,
               COPVEC);
  }
  if (nBp == 0) {
    *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_7b8.data._M_elems._48_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_7b8.data._M_elems._56_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_7b8.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_7b8.data._M_elems._40_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_7b8.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_7b8.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_7b8.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_7b8.data._M_elems._8_8_;
    (val->m_backend).exp = local_7b8.exp;
    (val->m_backend).neg = local_7b8.neg;
    (val->m_backend).fpclass = local_7b8.fpclass;
    (val->m_backend).prec_elem = local_7b8.prec_elem;
    uVar35._0_4_ = enterId.super_DataKey.info;
    uVar35._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar35;
  }
  lVar33 = (long)minIdx;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_548 = *(undefined8 *)&pBVar7[lVar33].val;
  uStack_540 = *(undefined8 *)((long)&pBVar7[lVar33].val + 8);
  local_538 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x10);
  uStack_530 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x18);
  local_528 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x20);
  uStack_520 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x28);
  local_518 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x30);
  uStack_510 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x38);
  iVar26 = *(int *)((long)&pBVar7[lVar33].val.m_backend + 0x40);
  bVar46 = *(bool *)((long)&pBVar7[lVar33].val.m_backend + 0x44);
  iVar27 = pBVar7[lVar33].idx;
  BVar19 = pBVar7[lVar33].src;
  uVar35 = *(undefined8 *)&(pBVar7->val).m_backend;
  uVar32 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 8);
  uVar13 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x10);
  uVar14 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x18);
  uVar15 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x20);
  uVar16 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x28);
  uVar31 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x38);
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x30) =
       *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x30);
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x38) = uVar31;
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x20) = uVar15;
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x28) = uVar16;
  *(undefined8 *)&pBVar7[lVar33].val = uVar35;
  *(undefined8 *)((long)&pBVar7[lVar33].val + 8) = uVar32;
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x10) = uVar13;
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x18) = uVar14;
  *(int *)((long)&pBVar7[lVar33].val.m_backend + 0x40) =
       *(int *)((long)&(pBVar7->val).m_backend + 0x40);
  *(bool *)((long)&pBVar7[lVar33].val.m_backend + 0x44) =
       *(bool *)((long)&(pBVar7->val).m_backend + 0x44);
  uVar35 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x48);
  BVar18 = pBVar7->src;
  pBVar7[lVar33].idx = pBVar7->idx;
  pBVar7[lVar33].src = BVar18;
  uVar32 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x48);
  *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x48) = uVar35;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x30) = local_518;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x38) = uStack_510;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x20) = local_528;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x28) = uStack_520;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x10) = local_538;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x18) = uStack_530;
  *(undefined8 *)&(pBVar7->val).m_backend = local_548;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 8) = uStack_540;
  *(int *)((long)&(pBVar7->val).m_backend + 0x40) = iVar26;
  *(bool *)((long)&(pBVar7->val).m_backend + 0x44) = bVar46;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x48) = uVar32;
  pBVar7->idx = iVar27;
  pBVar7->src = BVar19;
  pnVar40 = (((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver)->theCoTest).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_5a8.data._M_elems[0] = pnVar40[leaveIdx].m_backend.data._M_elems[0];
  puVar36 = (uint *)((long)&pnVar40[leaveIdx].m_backend.data + 0x30);
  uVar35 = *(undefined8 *)(puVar36 + 2);
  lowstab.m_backend.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar36 >> 0x20);
  lowstab.m_backend.data._M_elems[0xd] = (uint)uVar35;
  lowstab.m_backend.data._M_elems[0xe] = (uint)((ulong)uVar35 >> 0x20);
  puVar36 = (uint *)((long)&pnVar40[leaveIdx].m_backend.data + 0x24);
  lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar36;
  uVar32 = *(undefined8 *)(puVar36 + 2);
  lowstab.m_backend.data._M_elems[10] = (uint)uVar32;
  lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar32 >> 0x20);
  puVar36 = (uint *)((long)&pnVar40[leaveIdx].m_backend.data + 0x14);
  lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
  puVar2 = (uint *)((long)&pnVar40[leaveIdx].m_backend.data + 4);
  lowstab.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar2;
  local_5a8.exp = pnVar40[leaveIdx].m_backend.exp;
  local_5a8.neg = pnVar40[leaveIdx].m_backend.neg;
  local_5a8.fpclass = pnVar40[leaveIdx].m_backend.fpclass;
  local_5a8.prec_elem = pnVar40[leaveIdx].m_backend.prec_elem;
  if (local_5a8.neg == true) {
    local_5a8.neg = local_5a8.fpclass == cpp_dec_float_finite && local_5a8.data._M_elems[0] == 0;
  }
  local_5a8.data._M_elems[1] = (uint)*(undefined8 *)puVar2;
  local_5a8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
  local_5a8.data._M_elems[3] = (uint)*(undefined8 *)(puVar2 + 2);
  local_5a8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar2 + 2) >> 0x20);
  local_5a8.data._M_elems[5] = (uint)*(undefined8 *)puVar36;
  local_5a8.data._M_elems[6] = (uint)((ulong)*(undefined8 *)puVar36 >> 0x20);
  local_5a8.data._M_elems[7] = (uint)*(undefined8 *)(puVar36 + 2);
  local_5a8.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(puVar36 + 2) >> 0x20);
  local_5a8.data._M_elems[9] = lowstab.m_backend.data._M_elems[8];
  local_5a8.data._M_elems[10] = lowstab.m_backend.data._M_elems[9];
  local_5a8.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xb];
  local_5a8.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xc];
  local_5a8.data._M_elems._56_5_ = SUB85(uVar35,0);
  local_5a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar35 >> 0x28);
  local_5a8.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[10];
  if (local_5a8.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_5a8,&lowstab.m_backend);
    if (iVar26 == 0) {
      pSVar5 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      local_5a8.data._M_elems[0] = (pSVar5->instableLeaveVal).m_backend.data._M_elems[0];
      local_5a8.exp = (pSVar5->instableLeaveVal).m_backend.exp;
      local_5a8.neg = (pSVar5->instableLeaveVal).m_backend.neg;
      local_5a8.fpclass = (pSVar5->instableLeaveVal).m_backend.fpclass;
      local_5a8.prec_elem = (pSVar5->instableLeaveVal).m_backend.prec_elem;
      if (local_5a8.neg == true) {
        local_5a8.neg = local_5a8.fpclass == cpp_dec_float_finite && local_5a8.data._M_elems[0] == 0
        ;
      }
      uVar35 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 1);
      uVar32 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 3);
      uVar13 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 5);
      uVar14 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 7);
      uVar15 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 9);
      uVar16 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 0xb);
      uVar31 = *(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 0xe);
      local_5a8.data._M_elems[0xd] =
           (uint)((ulong)*(undefined8 *)((pSVar5->instableLeaveVal).m_backend.data._M_elems + 0xc)
                 >> 0x20);
      local_5a8.data._M_elems._56_5_ = SUB85(uVar31,0);
      local_5a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar31 >> 0x28);
      local_5a8.data._M_elems[9] = (uint)uVar15;
      local_5a8.data._M_elems[10] = (uint)((ulong)uVar15 >> 0x20);
      local_5a8.data._M_elems[0xb] = (uint)uVar16;
      local_5a8.data._M_elems[0xc] = (uint)((ulong)uVar16 >> 0x20);
      local_5a8.data._M_elems[5] = (uint)uVar13;
      local_5a8.data._M_elems[6] = (uint)((ulong)uVar13 >> 0x20);
      local_5a8.data._M_elems[7] = (uint)uVar14;
      local_5a8.data._M_elems[8] = (uint)((ulong)uVar14 >> 0x20);
      local_5a8.data._M_elems[1] = (uint)uVar35;
      local_5a8.data._M_elems[2] = (uint)((ulong)uVar35 >> 0x20);
      local_5a8.data._M_elems[3] = (uint)uVar32;
      local_5a8.data._M_elems[4] = (uint)((ulong)uVar32 >> 0x20);
    }
  }
  compare.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_910 = 0;
  pcVar37 = (cpp_dec_float<100U,_int,_void> *)0x0;
  local_7e8 = val;
  if ((0 < nBp) && (local_5a8.fpclass != cpp_dec_float_NaN)) {
    pcVar37 = (cpp_dec_float<100U,_int,_void> *)0x0;
    while( true ) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&lowstab.m_backend,0,(type *)0x0);
      iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_5a8,&lowstab.m_backend);
      if (iVar26 < 1) break;
      if ((int)pcVar37 < (int)local_910) {
        uVar28 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                           ((this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&compare,(int)pcVar37 + 1,nBp,
                            4,0,0,true);
        pcVar37 = (cpp_dec_float<100U,_int,_void> *)(ulong)uVar28;
      }
      lVar33 = (long)(int)local_910;
      pSVar5 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      pBVar7 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar26 = pBVar7[lVar33].idx;
      if (pBVar7[lVar33].src == PVEC) {
        if (0 < pSVar5->theRep *
                ((pSVar5->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat)->data[iVar26]) {
          pBVar7[lVar33].idx = -1;
          pUVar39 = pSVar5->thePvec;
          goto LAB_00490cb6;
        }
        pnVar1 = local_7d0 + iVar26;
        local_4c8 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        uStack_4c0 = *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2);
        puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 4;
        local_4b8 = *(undefined8 *)puVar36;
        uStack_4b0 = *(undefined8 *)(puVar36 + 2);
        lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
        puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 8;
        lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar36;
        uStack_4a0 = *(undefined8 *)(puVar36 + 2);
        puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 0xc;
        local_498 = *(undefined8 *)puVar36;
        uStack_490 = *(undefined8 *)(puVar36 + 2);
        lowstab.m_backend.exp = local_7d0[iVar26].m_backend.exp;
        lowstab.m_backend.neg = local_7d0[iVar26].m_backend.neg;
        lowstab.m_backend.fpclass = local_7d0[iVar26].m_backend.fpclass;
        lowstab.m_backend.prec_elem = local_7d0[iVar26].m_backend.prec_elem;
        lowstab.m_backend.data._M_elems[0xc] = (uint)local_498;
        lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)local_498 >> 0x20);
        lowstab.m_backend.data._M_elems[0xe] = (uint)uStack_490;
        lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uStack_490 >> 0x20);
        lowstab.m_backend.data._M_elems[10] = (uint)uStack_4a0;
        lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uStack_4a0 >> 0x20);
        if ((lowstab.m_backend.neg == true) &&
           (lowstab.m_backend.data._M_elems[0] = (uint)local_4c8,
           lowstab.m_backend.fpclass != cpp_dec_float_finite ||
           lowstab.m_backend.data._M_elems[0] != 0)) {
          lowstab.m_backend.neg = false;
        }
        pnVar40 = (pSVar5->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        local_700._0_4_ = cpp_dec_float_finite;
        local_700._4_4_ = 0x10;
        local_748 = (undefined1  [16])0x0;
        local_738 = (undefined1  [16])0x0;
        local_728 = (undefined1  [16])0x0;
        local_718[0] = 0;
        local_718[1] = 0;
        stack0xfffffffffffff8f0 = 0;
        uStack_70b = 0;
        iStack_708 = 0;
        bStack_704 = false;
        if ((pointer)local_748 != pnVar40) {
          local_748 = *(undefined1 (*) [16])&(pnVar40->m_backend).data;
          local_738 = *(undefined1 (*) [16])((long)&(pnVar40->m_backend).data + 0x10);
          local_728 = *(undefined1 (*) [16])((long)&(pnVar40->m_backend).data + 0x20);
          local_718._0_8_ = *(undefined8 *)((long)&(pnVar40->m_backend).data + 0x30);
          uVar35 = *(undefined8 *)((long)&(pnVar40->m_backend).data + 0x38);
          stack0xfffffffffffff8f0 = (undefined5)uVar35;
          uStack_70b = (undefined3)((ulong)uVar35 >> 0x28);
          iStack_708 = (pnVar40->m_backend).exp;
          bStack_704 = (pnVar40->m_backend).neg;
          local_700._0_4_ = (pnVar40->m_backend).fpclass;
          local_700._4_4_ = (pnVar40->m_backend).prec_elem;
        }
        lowstab.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
        local_4a8 = (uint  [2])lowstab.m_backend.data._M_elems._32_8_;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  ((cpp_dec_float<100U,_int,_void> *)local_748,&lowstab.m_backend);
        pcVar43 = &(((this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver)->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar26].m_backend;
        local_7f0._0_4_ = cpp_dec_float_finite;
        local_7f0._4_4_ = 0x10;
        local_838 = (undefined1  [16])0x0;
        local_828 = (undefined1  [16])0x0;
        local_818 = (undefined1  [16])0x0;
        local_808[0] = 0;
        local_808[1] = 0;
        stack0xfffffffffffff800 = 0;
        uStack_7fb = 0;
        iStack_7f8 = 0;
        bStack_7f4 = false;
        if ((cpp_dec_float<100U,_int,_void> *)local_838 != pcVar43) {
          local_838 = *(undefined1 (*) [16])(pcVar43->data)._M_elems;
          local_828 = *(undefined1 (*) [16])((pcVar43->data)._M_elems + 4);
          local_818 = *(undefined1 (*) [16])((pcVar43->data)._M_elems + 8);
          local_808._0_8_ = *(undefined8 *)((pcVar43->data)._M_elems + 0xc);
          uVar35 = *(undefined8 *)((pcVar43->data)._M_elems + 0xe);
          stack0xfffffffffffff800 = (undefined5)uVar35;
          uStack_7fb = (undefined3)((ulong)uVar35 >> 0x28);
          iStack_7f8 = pcVar43->exp;
          bStack_7f4 = pcVar43->neg;
          local_7f0._0_4_ = pcVar43->fpclass;
          local_7f0._4_4_ = pcVar43->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  ((cpp_dec_float<100U,_int,_void> *)local_838,&lowstab.m_backend);
        x.m_backend.data._M_elems[0xc] = local_718[0];
        x.m_backend.data._M_elems[0xd] = local_718[1];
        x.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff8f0;
        x.m_backend.data._M_elems[0xf]._1_3_ = uStack_70b;
        x.m_backend.data._M_elems[8] = local_728._0_4_;
        x.m_backend.data._M_elems[9] = local_728._4_4_;
        x.m_backend.data._M_elems[10] = local_728._8_4_;
        x.m_backend.data._M_elems[0xb] = local_728._12_4_;
        x.m_backend.data._M_elems[4] = local_738._0_4_;
        x.m_backend.data._M_elems[5] = local_738._4_4_;
        x.m_backend.data._M_elems[6] = local_738._8_4_;
        x.m_backend.data._M_elems[7] = local_738._12_4_;
        x.m_backend.data._M_elems[0] = local_748._0_4_;
        x.m_backend.data._M_elems[1] = local_748._4_4_;
        x.m_backend.data._M_elems[2] = local_748._8_4_;
        x.m_backend.data._M_elems[3] = local_748._12_4_;
        x.m_backend.exp = iStack_708;
        x.m_backend.neg = bStack_704;
        x.m_backend.fpclass = (fpclass_type)local_700;
        x.m_backend.prec_elem = local_700._4_4_;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&x.m_backend,(cpp_dec_float<100U,_int,_void> *)local_838);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_5a8,&x.m_backend);
        val = local_7e8;
        if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
          goto joined_r0x004912e0;
        }
      }
      else if (pSVar5->theRep *
               ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.costat)->data[iVar26] < 1) {
        pnVar1 = local_7c8 + iVar26;
        local_508 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        uStack_500 = *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2);
        puVar36 = local_7c8[iVar26].m_backend.data._M_elems + 4;
        local_4f8 = *(undefined8 *)puVar36;
        uStack_4f0 = *(undefined8 *)(puVar36 + 2);
        lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
        puVar36 = local_7c8[iVar26].m_backend.data._M_elems + 8;
        lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar36;
        uStack_4e0 = *(undefined8 *)(puVar36 + 2);
        puVar36 = local_7c8[iVar26].m_backend.data._M_elems + 0xc;
        local_4d8 = *(undefined8 *)puVar36;
        uStack_4d0 = *(undefined8 *)(puVar36 + 2);
        lowstab.m_backend.exp = local_7c8[iVar26].m_backend.exp;
        lowstab.m_backend.neg = local_7c8[iVar26].m_backend.neg;
        lowstab.m_backend.fpclass = local_7c8[iVar26].m_backend.fpclass;
        lowstab.m_backend.prec_elem = local_7c8[iVar26].m_backend.prec_elem;
        lowstab.m_backend.data._M_elems[0xc] = (uint)local_4d8;
        lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)local_4d8 >> 0x20);
        lowstab.m_backend.data._M_elems[0xe] = (uint)uStack_4d0;
        lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uStack_4d0 >> 0x20);
        lowstab.m_backend.data._M_elems[10] = (uint)uStack_4e0;
        lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uStack_4e0 >> 0x20);
        if ((lowstab.m_backend.neg == true) &&
           (lowstab.m_backend.data._M_elems[0] = (uint)local_508,
           lowstab.m_backend.fpclass != cpp_dec_float_finite ||
           lowstab.m_backend.data._M_elems[0] != 0)) {
          lowstab.m_backend.neg = false;
        }
        pnVar40 = (pSVar5->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar26;
        local_700._0_4_ = cpp_dec_float_finite;
        local_700._4_4_ = 0x10;
        local_748 = (undefined1  [16])0x0;
        local_738 = (undefined1  [16])0x0;
        local_728 = (undefined1  [16])0x0;
        local_718[0] = 0;
        local_718[1] = 0;
        stack0xfffffffffffff8f0 = 0;
        uStack_70b = 0;
        iStack_708 = 0;
        bStack_704 = false;
        if ((pointer)local_748 != pnVar40) {
          local_748 = *(undefined1 (*) [16])&(pnVar40->m_backend).data;
          local_738 = *(undefined1 (*) [16])((long)&(pnVar40->m_backend).data + 0x10);
          local_728 = *(undefined1 (*) [16])((long)&(pnVar40->m_backend).data + 0x20);
          local_718._0_8_ = *(undefined8 *)((long)&(pnVar40->m_backend).data + 0x30);
          uVar35 = *(undefined8 *)((long)&(pnVar40->m_backend).data + 0x38);
          stack0xfffffffffffff8f0 = (undefined5)uVar35;
          uStack_70b = (undefined3)((ulong)uVar35 >> 0x28);
          iStack_708 = (pnVar40->m_backend).exp;
          bStack_704 = (pnVar40->m_backend).neg;
          local_700._0_4_ = (pnVar40->m_backend).fpclass;
          local_700._4_4_ = (pnVar40->m_backend).prec_elem;
        }
        lowstab.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
        local_4e8 = (uint  [2])lowstab.m_backend.data._M_elems._32_8_;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  ((cpp_dec_float<100U,_int,_void> *)local_748,&lowstab.m_backend);
        pcVar43 = &(((this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver)->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar26].m_backend;
        local_7f0._0_4_ = cpp_dec_float_finite;
        local_7f0._4_4_ = 0x10;
        local_838 = (undefined1  [16])0x0;
        local_828 = (undefined1  [16])0x0;
        local_818 = (undefined1  [16])0x0;
        local_808[0] = 0;
        local_808[1] = 0;
        stack0xfffffffffffff800 = 0;
        uStack_7fb = 0;
        iStack_7f8 = 0;
        bStack_7f4 = false;
        if ((cpp_dec_float<100U,_int,_void> *)local_838 != pcVar43) {
          local_838 = *(undefined1 (*) [16])(pcVar43->data)._M_elems;
          local_828 = *(undefined1 (*) [16])((pcVar43->data)._M_elems + 4);
          local_818 = *(undefined1 (*) [16])((pcVar43->data)._M_elems + 8);
          local_808._0_8_ = *(undefined8 *)((pcVar43->data)._M_elems + 0xc);
          uVar35 = *(undefined8 *)((pcVar43->data)._M_elems + 0xe);
          stack0xfffffffffffff800 = (undefined5)uVar35;
          uStack_7fb = (undefined3)((ulong)uVar35 >> 0x28);
          iStack_7f8 = pcVar43->exp;
          bStack_7f4 = pcVar43->neg;
          local_7f0._0_4_ = pcVar43->fpclass;
          local_7f0._4_4_ = pcVar43->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  ((cpp_dec_float<100U,_int,_void> *)local_838,&lowstab.m_backend);
        x.m_backend.data._M_elems[0xc] = local_718[0];
        x.m_backend.data._M_elems[0xd] = local_718[1];
        x.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff8f0;
        x.m_backend.data._M_elems[0xf]._1_3_ = uStack_70b;
        x.m_backend.data._M_elems[8] = local_728._0_4_;
        x.m_backend.data._M_elems[9] = local_728._4_4_;
        x.m_backend.data._M_elems[10] = local_728._8_4_;
        x.m_backend.data._M_elems[0xb] = local_728._12_4_;
        x.m_backend.data._M_elems[4] = local_738._0_4_;
        x.m_backend.data._M_elems[5] = local_738._4_4_;
        x.m_backend.data._M_elems[6] = local_738._8_4_;
        x.m_backend.data._M_elems[7] = local_738._12_4_;
        x.m_backend.data._M_elems[0] = local_748._0_4_;
        x.m_backend.data._M_elems[1] = local_748._4_4_;
        x.m_backend.data._M_elems[2] = local_748._8_4_;
        x.m_backend.data._M_elems[3] = local_748._12_4_;
        x.m_backend.exp = iStack_708;
        x.m_backend.neg = bStack_704;
        x.m_backend.fpclass = (fpclass_type)local_700;
        x.m_backend.prec_elem = local_700._4_4_;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&x.m_backend,(cpp_dec_float<100U,_int,_void> *)local_838);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_5a8,&x.m_backend);
        val = local_7e8;
        if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
joined_r0x004912e0:
          val = local_7e8;
          if ((local_6e8.fpclass != cpp_dec_float_NaN) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&lowstab.m_backend,&local_6e8), val = local_7e8, 0 < iVar26)) {
            local_6e8.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
            local_6e8.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
            local_6e8.data._M_elems._56_5_ =
                 SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],
                                lowstab.m_backend.data._M_elems[0xe]),0);
            local_6e8.data._M_elems[0xf]._1_3_ =
                 (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
            local_6e8.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
            local_6e8.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
            local_6e8.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
            local_6e8.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
            local_6e8.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
            local_6e8.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
            local_6e8.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
            local_6e8.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
            local_6e8.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
            local_6e8.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
            local_6e8.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
            local_6e8.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
            local_6e8.exp = lowstab.m_backend.exp;
            local_6e8.neg = lowstab.m_backend.neg;
            local_6e8.fpclass = lowstab.m_backend.fpclass;
            local_6e8.prec_elem = lowstab.m_backend.prec_elem;
          }
        }
      }
      else {
        pBVar7[lVar33].idx = -1;
        pUVar39 = pSVar5->theCoPvec;
LAB_00490cb6:
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearIdx(&pUVar39->thedelta,iVar26);
      }
      local_910 = local_910 + 1;
      if ((nBp <= (int)local_910) || (local_5a8.fpclass == cpp_dec_float_NaN)) break;
    }
  }
  local_910 = local_910 - 1;
  pnVar1 = &(this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  if ((local_5a8.fpclass != cpp_dec_float_NaN) &&
     ((((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .delta.m_backend.fpclass != cpp_dec_float_NaN &&
       (iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_5a8,&pnVar1->m_backend), 0 < iVar26)) &&
      (nBp + -1 <= (int)local_910)))) {
    lowstab.m_backend.fpclass = cpp_dec_float_finite;
    lowstab.m_backend.prec_elem = 0x10;
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0;
    lowstab.m_backend.data._M_elems[2] = 0;
    lowstab.m_backend.data._M_elems[3] = 0;
    lowstab.m_backend.data._M_elems[4] = 0;
    lowstab.m_backend.data._M_elems[5] = 0;
    lowstab.m_backend.data._M_elems[6] = 0;
    lowstab.m_backend.data._M_elems[7] = 0;
    lowstab.m_backend.data._M_elems[8] = 0;
    lowstab.m_backend.data._M_elems[9] = 0;
    lowstab.m_backend.data._M_elems[10] = 0;
    lowstab.m_backend.data._M_elems[0xb] = 0;
    lowstab.m_backend.data._M_elems[0xc] = 0;
    lowstab.m_backend.data._M_elems[0xd] = 0;
    lowstab.m_backend.data._M_elems[0xe] = 0;
    lowstab.m_backend.data._M_elems[0xf] = 0;
    lowstab.m_backend.exp = 0;
    lowstab.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (local_6f0,&lowstab.m_backend);
    *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_7b8.data._M_elems._48_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_7b8.data._M_elems._56_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_7b8.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_7b8.data._M_elems._40_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_7b8.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_7b8.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_7b8.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_7b8.data._M_elems._8_8_;
    (val->m_backend).exp = local_7b8.exp;
    (val->m_backend).neg = local_7b8.neg;
    (val->m_backend).fpclass = local_7b8.fpclass;
    (val->m_backend).prec_elem = local_7b8.prec_elem;
    polish = false;
LAB_0049088b:
    DVar29 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::selectEnter(&this->
                                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,val,leaveIdx,polish);
    uVar32._0_4_ = DVar29.info;
    uVar32._4_4_ = DVar29.idx;
    return (SPxId)uVar32;
  }
  lVar33 = (long)(int)local_910;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_748 = *(undefined1 (*) [16])&pBVar7[lVar33].val.m_backend;
  local_738 = *(undefined1 (*) [16])((long)&pBVar7[lVar33].val.m_backend + 0x10);
  local_728 = *(undefined1 (*) [16])((long)&pBVar7[lVar33].val.m_backend + 0x20);
  puVar36 = (uint *)((long)&pBVar7[lVar33].val.m_backend + 0x30);
  local_718._0_8_ = *(undefined8 *)puVar36;
  uVar35 = *(undefined8 *)(puVar36 + 2);
  stack0xfffffffffffff8f0 = (undefined5)uVar35;
  uStack_70b = (undefined3)((ulong)uVar35 >> 0x28);
  iStack_708 = *(int *)((long)&pBVar7[lVar33].val.m_backend + 0x40);
  bStack_704 = *(bool *)((long)&pBVar7[lVar33].val.m_backend + 0x44);
  local_700 = *(undefined8 *)((long)&pBVar7[lVar33].val.m_backend + 0x48);
  local_89c = 0xffffffff;
  do {
    lVar44 = lVar33 + 1;
    if (nBp <= lVar44) break;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)local_838,0,(type *)0x0);
    if ((int)pcVar37 <= lVar33) {
      uVar28 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                         ((this->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,&compare,(int)pcVar37 + 1,nBp,4,
                          0,0,true);
      pcVar37 = (cpp_dec_float<100U,_int,_void> *)(ulong)uVar28;
    }
    pSVar5 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar26 = pBVar7[lVar44].idx;
    uVar13 = local_7f0;
    if (pBVar7[lVar44].src == PVEC) {
      if (0 < pSVar5->theRep *
              ((pSVar5->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.stat)->data[iVar26]) {
        pBVar7[lVar44].idx = -1;
        pUVar39 = pSVar5->thePvec;
        goto LAB_004914e3;
      }
      pnVar41 = local_7d0 + iVar26;
      x_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar41->m_backend).data._M_elems;
      x_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 2);
      puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 4;
      x_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar36;
      x_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar36 + 2);
      lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
      puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 8;
      lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar36;
      x_1.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar36 + 2);
      puVar36 = local_7d0[iVar26].m_backend.data._M_elems + 0xc;
      x_1.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar36;
      uVar35 = *(undefined8 *)(puVar36 + 2);
      x_1.m_backend.data._M_elems._56_5_ = SUB85(uVar35,0);
      x_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar35 >> 0x28);
      lowstab.m_backend.exp = local_7d0[iVar26].m_backend.exp;
      x_1.m_backend.neg = local_7d0[iVar26].m_backend.neg;
      x_1.m_backend.fpclass = local_7d0[iVar26].m_backend.fpclass;
      x_1.m_backend.prec_elem = local_7d0[iVar26].m_backend.prec_elem;
      lowstab.m_backend.data._M_elems[0xc] = x_1.m_backend.data._M_elems[0xc];
      lowstab.m_backend.data._M_elems[0xd] = x_1.m_backend.data._M_elems[0xd];
      lowstab.m_backend.data._M_elems[0xe] = (uint)uVar35;
      lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar35 >> 0x20);
      lowstab.m_backend.data._M_elems[10] = x_1.m_backend.data._M_elems[10];
      lowstab.m_backend.data._M_elems[0xb] = x_1.m_backend.data._M_elems[0xb];
      lowstab.m_backend.prec_elem = x_1.m_backend.prec_elem;
      lowstab.m_backend.fpclass = x_1.m_backend.fpclass;
      lowstab.m_backend.neg = x_1.m_backend.neg;
      if ((x_1.m_backend.neg == true) &&
         (lowstab.m_backend.data._M_elems[0] = x_1.m_backend.data._M_elems[0],
         lowstab.m_backend.data._M_elems[0] != 0 || x_1.m_backend.fpclass != cpp_dec_float_finite))
      {
        lowstab.m_backend.neg = false;
      }
      x_1.m_backend.data._M_elems._32_8_ = lowstab.m_backend.data._M_elems._32_8_;
      x_1.m_backend.exp = lowstab.m_backend.exp;
      if (((x_1.m_backend.fpclass != cpp_dec_float_NaN) && (local_6e8.fpclass != cpp_dec_float_NaN))
         && (lowstab.m_backend.data._M_elems._0_16_ =
                  *(undefined1 (*) [16])(pnVar41->m_backend).data._M_elems,
            iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&lowstab.m_backend,&local_6e8), uVar13 = local_7f0, 0 < iVar27)) {
        pSVar5 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pSVar8 = pSVar5->thevectors;
        pIVar9 = (pSVar8->set).theitem;
        iVar27 = (pSVar8->set).thekey[iVar26].idx;
        pUVar39 = pSVar5->theCoPvec;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems[6] = 0;
        lowstab.m_backend.data._M_elems[7] = 0;
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        iVar45 = pIVar9[iVar27].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        local_648 = pcVar37;
        local_550 = lVar44;
        if (0 < iVar45) {
          pNVar38 = pIVar9[iVar27].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          iVar45 = iVar45 + 1;
          do {
            pNVar34 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((pUVar39->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + pNVar38->idx);
            x.m_backend.fpclass = cpp_dec_float_finite;
            x.m_backend.prec_elem = 0x10;
            x.m_backend.data._M_elems[0] = 0;
            x.m_backend.data._M_elems[1] = 0;
            x.m_backend.data._M_elems[2] = 0;
            x.m_backend.data._M_elems[3] = 0;
            x.m_backend.data._M_elems[4] = 0;
            x.m_backend.data._M_elems[5] = 0;
            x.m_backend.data._M_elems[6] = 0;
            x.m_backend.data._M_elems[7] = 0;
            x.m_backend.data._M_elems[8] = 0;
            x.m_backend.data._M_elems[9] = 0;
            x.m_backend.data._M_elems[10] = 0;
            x.m_backend.data._M_elems[0xb] = 0;
            x.m_backend.data._M_elems[0xc] = 0;
            x.m_backend.data._M_elems[0xd] = 0;
            x.m_backend.data._M_elems._56_5_ = 0;
            x.m_backend.data._M_elems[0xf]._1_3_ = 0;
            x.m_backend.exp = 0;
            x.m_backend.neg = false;
            v = pNVar38;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&x != pNVar34) &&
               (v = pNVar34,
               pNVar38 !=
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&x)) {
              x.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pNVar38->val).m_backend.data._M_elems;
              x.m_backend.data._M_elems._16_16_ =
                   *(undefined1 (*) [16])((pNVar38->val).m_backend.data._M_elems + 4);
              x.m_backend.data._M_elems._32_16_ =
                   *(undefined1 (*) [16])((pNVar38->val).m_backend.data._M_elems + 8);
              x.m_backend.data._M_elems._48_8_ =
                   *(undefined8 *)((pNVar38->val).m_backend.data._M_elems + 0xc);
              uVar35 = *(undefined8 *)((pNVar38->val).m_backend.data._M_elems + 0xe);
              x.m_backend.data._M_elems._56_5_ = SUB85(uVar35,0);
              x.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar35 >> 0x28);
              x.m_backend.exp = (pNVar38->val).m_backend.exp;
              x.m_backend.neg = (pNVar38->val).m_backend.neg;
              x.m_backend.fpclass = (pNVar38->val).m_backend.fpclass;
              x.m_backend.prec_elem = (pNVar38->val).m_backend.prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)&x,(cpp_dec_float<100U,_int,_void> *)v);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&lowstab.m_backend,(cpp_dec_float<100U,_int,_void> *)&x);
            pNVar38 = pNVar38 + 1;
            iVar45 = iVar45 + -1;
          } while (1 < iVar45);
        }
        uVar35 = lowstab.m_backend.data._M_elems._0_8_;
        uVar32 = lowstab.m_backend.data._M_elems._8_8_;
        uVar13 = lowstab.m_backend.data._M_elems._16_8_;
        uVar14 = lowstab.m_backend.data._M_elems._24_8_;
        x.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
        x.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
        x.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
        x.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
        x.m_backend.data._M_elems._56_5_ =
             SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],
                            lowstab.m_backend.data._M_elems[0xe]),0);
        x.m_backend.data._M_elems[0xf]._1_3_ =
             (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
        x.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
        x.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
        x.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
        x.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
        x.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
        x.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
        x.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
        x.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
        x.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
        x.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
        pnVar40 = (((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x30) = x.m_backend.data._M_elems._48_8_;
        *(ulong *)((long)(pnVar40 + iVar26) + 0x38) =
             CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]);
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x20) = lowstab.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x28) = x.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x10) = uVar13;
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x18) = uVar14;
        *(undefined8 *)&pnVar40[iVar26].m_backend = uVar35;
        *(undefined8 *)((long)&pnVar40[iVar26].m_backend + 8) = uVar32;
        *(int *)((long)(pnVar40 + iVar26) + 0x40) = lowstab.m_backend.exp;
        *(bool *)((long)(pnVar40 + iVar26) + 0x44) = lowstab.m_backend.neg;
        *(undefined8 *)((long)(pnVar40 + iVar26) + 0x48) = lowstab.m_backend._72_8_;
        pnVar40 = local_7e0;
        if (x_1.m_backend.fpclass != cpp_dec_float_NaN) {
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x10;
          lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&x_1.m_backend,&lowstab.m_backend);
          pnVar40 = local_7e0;
          if (0 < iVar27) {
            pnVar40 = local_768;
          }
        }
        lVar44 = local_550;
        pcVar37 = local_648;
        local_838 = *(undefined1 (*) [16])pnVar40[iVar26].m_backend.data._M_elems;
        puVar36 = pnVar40[iVar26].m_backend.data._M_elems + 4;
        local_828 = *(undefined1 (*) [16])puVar36;
        puVar2 = pnVar40[iVar26].m_backend.data._M_elems + 8;
        local_818 = *(undefined1 (*) [16])puVar2;
        puVar3 = pnVar40[iVar26].m_backend.data._M_elems + 0xc;
        local_808._0_8_ = *(undefined8 *)puVar3;
        uVar35 = *(undefined8 *)(puVar3 + 2);
        stack0xfffffffffffff800 = (undefined5)uVar35;
        uStack_7fb = (undefined3)((ulong)uVar35 >> 0x28);
        iStack_7f8 = pnVar40[iVar26].m_backend.exp;
        bStack_7f4 = pnVar40[iVar26].m_backend.neg;
        local_7f0._0_4_ = pnVar40[iVar26].m_backend.fpclass;
        local_7f0._4_4_ = pnVar40[iVar26].m_backend.prec_elem;
        x.m_backend.fpclass = cpp_dec_float_finite;
        x.m_backend.prec_elem = 0x10;
        x.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        x.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        x.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        x.m_backend.data._M_elems[0xc] = 0;
        x.m_backend.data._M_elems[0xd] = 0;
        x.m_backend.data._M_elems._56_5_ = 0;
        x.m_backend.data._M_elems[0xf]._1_3_ = 0;
        x.m_backend.exp = 0;
        x.m_backend.neg = false;
        if (&x.m_backend == &local_760[iVar26].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&x.m_backend,(cpp_dec_float<100U,_int,_void> *)local_838);
          if (x.m_backend.data._M_elems[0] != 0 || x.m_backend.fpclass != cpp_dec_float_finite) {
            x.m_backend.neg = (bool)(x.m_backend.neg ^ 1);
          }
        }
        else {
          x.m_backend.prec_elem = local_7f0._4_4_;
          x.m_backend.fpclass = (fpclass_type)local_7f0;
          x.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])pnVar40[iVar26].m_backend.data._M_elems;
          x.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
          x.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])puVar2;
          x.m_backend.data._M_elems._48_8_ = local_808._0_8_;
          x.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff800;
          x.m_backend.data._M_elems[0xf]._1_3_ = uStack_7fb;
          x.m_backend.exp = iStack_7f8;
          x.m_backend.neg = bStack_7f4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&x.m_backend,&local_760[iVar26].m_backend);
        }
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x10;
        lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&lowstab.m_backend,&x.m_backend,&x_1.m_backend);
        local_818._12_4_ = lowstab.m_backend.data._M_elems[0xb];
        local_818._8_4_ = lowstab.m_backend.data._M_elems[10];
        local_808[1] = lowstab.m_backend.data._M_elems[0xd];
        local_808[0] = lowstab.m_backend.data._M_elems[0xc];
        stack0xfffffffffffff800 =
             (undefined5)
             CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]);
        uStack_7fb = (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
        local_818._0_4_ = lowstab.m_backend.data._M_elems[8];
        local_818._4_4_ = lowstab.m_backend.data._M_elems[9];
        local_828._0_4_ = lowstab.m_backend.data._M_elems[4];
        local_828._4_4_ = lowstab.m_backend.data._M_elems[5];
        local_828._8_4_ = lowstab.m_backend.data._M_elems[6];
        local_828._12_4_ = lowstab.m_backend.data._M_elems[7];
        local_838._0_4_ = lowstab.m_backend.data._M_elems[0];
        local_838._4_4_ = lowstab.m_backend.data._M_elems[1];
        local_838._8_4_ = lowstab.m_backend.data._M_elems[2];
        local_838._12_4_ = lowstab.m_backend.data._M_elems[3];
        iStack_7f8 = lowstab.m_backend.exp;
        bStack_7f4 = lowstab.m_backend.neg;
        local_7f0._0_4_ = lowstab.m_backend.fpclass;
        local_7f0._4_4_ = lowstab.m_backend.prec_elem;
        uVar13 = local_7f0;
        if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_700 != cpp_dec_float_NaN)) &&
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_838,
                                (cpp_dec_float<100U,_int,_void> *)local_748), uVar13 = local_7f0,
           iVar26 < 1)) {
          local_6e8.neg = x_1.m_backend.neg;
          if (x_1.m_backend.neg == true) {
            local_6e8.neg =
                 x_1.m_backend.fpclass == cpp_dec_float_finite &&
                 x_1.m_backend.data._M_elems[0] == 0;
          }
          local_6e8.data._M_elems[0] = x_1.m_backend.data._M_elems[0];
          pnVar41 = &x_1;
          local_6e8.exp = x_1.m_backend.exp;
          local_6e8._72_8_ = x_1.m_backend._72_8_;
          goto LAB_00491f64;
        }
      }
LAB_00491c2f:
      local_7f0 = uVar13;
      lowstab.m_backend.fpclass = cpp_dec_float_finite;
      lowstab.m_backend.prec_elem = 0x10;
      lowstab.m_backend.data._M_elems[0] = 0;
      lowstab.m_backend.data._M_elems[1] = 0;
      lowstab.m_backend.data._M_elems[2] = 0;
      lowstab.m_backend.data._M_elems[3] = 0;
      lowstab.m_backend.data._M_elems[4] = 0;
      lowstab.m_backend.data._M_elems[5] = 0;
      lowstab.m_backend.data._M_elems[6] = 0;
      lowstab.m_backend.data._M_elems[7] = 0;
      lowstab.m_backend.data._M_elems[8] = 0;
      lowstab.m_backend.data._M_elems[9] = 0;
      lowstab.m_backend.data._M_elems[10] = 0;
      lowstab.m_backend.data._M_elems[0xb] = 0;
      lowstab.m_backend.data._M_elems[0xc] = 0;
      lowstab.m_backend.data._M_elems[0xd] = 0;
      lowstab.m_backend.data._M_elems[0xe] = 0;
      lowstab.m_backend.data._M_elems[0xf] = 0;
      lowstab.m_backend.exp = 0;
      lowstab.m_backend.neg = false;
      if (&lowstab != pnVar1) {
        lowstab.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
        lowstab.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.data._M_elems + 4);
        lowstab.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.data._M_elems + 8);
        uVar35 = *(undefined8 *)
                  ((this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .delta.m_backend.data._M_elems + 10);
        uVar32 = *(undefined8 *)
                  ((this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .delta.m_backend.data._M_elems + 0xc);
        uVar13 = *(undefined8 *)
                  ((this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .delta.m_backend.data._M_elems + 0xe);
        lowstab.m_backend.data._M_elems[0xc] = (uint)uVar32;
        lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)uVar32 >> 0x20);
        lowstab.m_backend.data._M_elems[0xe] = (uint)uVar13;
        lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
        lowstab.m_backend.data._M_elems[10] = (uint)uVar35;
        lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar35 >> 0x20);
        lowstab.m_backend.exp =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.exp;
        lowstab.m_backend.neg =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.neg;
        lowstab.m_backend.fpclass =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.fpclass;
        lowstab.m_backend.prec_elem =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&lowstab.m_backend,(cpp_dec_float<100U,_int,_void> *)local_748);
      bVar46 = false;
      if (((fpclass_type)local_7f0 != cpp_dec_float_NaN) &&
         (lowstab.m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)local_838,&lowstab.m_backend);
        bVar46 = 0 < iVar26;
      }
    }
    else {
      if (pSVar5->theRep *
          ((pSVar5->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.costat)->data[iVar26] < 1) {
        pnVar41 = local_7c8 + iVar26;
        x.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pnVar41->m_backend).data._M_elems;
        puVar36 = local_7c8[iVar26].m_backend.data._M_elems + 4;
        lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
        x.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
        puVar36 = local_7c8[iVar26].m_backend.data._M_elems + 8;
        lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar36;
        x.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])puVar36;
        puVar2 = local_7c8[iVar26].m_backend.data._M_elems + 0xc;
        x.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        uVar35 = *(undefined8 *)(puVar2 + 2);
        x.m_backend.data._M_elems._56_5_ = SUB85(uVar35,0);
        x.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar35 >> 0x28);
        lowstab.m_backend.exp = local_7c8[iVar26].m_backend.exp;
        x.m_backend.neg = local_7c8[iVar26].m_backend.neg;
        x.m_backend.fpclass = local_7c8[iVar26].m_backend.fpclass;
        x.m_backend.prec_elem = local_7c8[iVar26].m_backend.prec_elem;
        lowstab.m_backend.data._M_elems[0xc] = x.m_backend.data._M_elems[0xc];
        lowstab.m_backend.data._M_elems[0xd] = x.m_backend.data._M_elems[0xd];
        lowstab.m_backend.data._M_elems[0xe] = (uint)uVar35;
        lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar35 >> 0x20);
        lowstab.m_backend.data._M_elems[10] = (uint)*(undefined8 *)(puVar36 + 2);
        lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)*(undefined8 *)(puVar36 + 2) >> 0x20);
        lowstab.m_backend.prec_elem = x.m_backend.prec_elem;
        lowstab.m_backend.fpclass = x.m_backend.fpclass;
        lowstab.m_backend.neg = x.m_backend.neg;
        if ((x.m_backend.neg == true) &&
           (lowstab.m_backend.data._M_elems[0] =
                 (uint)*(undefined8 *)(pnVar41->m_backend).data._M_elems,
           lowstab.m_backend.data._M_elems[0] != 0 || x.m_backend.fpclass != cpp_dec_float_finite))
        {
          lowstab.m_backend.neg = false;
        }
        x.m_backend.exp = lowstab.m_backend.exp;
        if (((x.m_backend.fpclass != cpp_dec_float_NaN) && (local_6e8.fpclass != cpp_dec_float_NaN))
           && (lowstab.m_backend.data._M_elems._0_16_ =
                    *(undefined1 (*) [16])(pnVar41->m_backend).data._M_elems,
              iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&lowstab.m_backend,&local_6e8), uVar13 = local_7f0, 0 < iVar27)) {
          pnVar40 = local_7d8;
          if (x.m_backend.fpclass != cpp_dec_float_NaN) {
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x10;
            lowstab.m_backend.data._M_elems[0] = 0;
            lowstab.m_backend.data._M_elems[1] = 0;
            lowstab.m_backend.data._M_elems[2] = 0;
            lowstab.m_backend.data._M_elems[3] = 0;
            lowstab.m_backend.data._M_elems[4] = 0;
            lowstab.m_backend.data._M_elems[5] = 0;
            lowstab.m_backend.data._M_elems[6] = 0;
            lowstab.m_backend.data._M_elems[7] = 0;
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.0);
            iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&x.m_backend,&lowstab.m_backend);
            pnVar40 = local_7d8;
            if (0 < iVar27) {
              pnVar40 = local_758;
            }
          }
          pnVar41 = pnVar40 + iVar26;
          local_838 = *(undefined1 (*) [16])(pnVar41->m_backend).data._M_elems;
          puVar36 = pnVar40[iVar26].m_backend.data._M_elems + 4;
          local_828 = *(undefined1 (*) [16])puVar36;
          puVar2 = pnVar40[iVar26].m_backend.data._M_elems + 8;
          local_818 = *(undefined1 (*) [16])puVar2;
          puVar3 = pnVar40[iVar26].m_backend.data._M_elems + 0xc;
          local_808._0_8_ = *(undefined8 *)puVar3;
          uVar35 = *(undefined8 *)(puVar3 + 2);
          stack0xfffffffffffff800 = (undefined5)uVar35;
          uStack_7fb = (undefined3)((ulong)uVar35 >> 0x28);
          iStack_7f8 = pnVar40[iVar26].m_backend.exp;
          bStack_7f4 = pnVar40[iVar26].m_backend.neg;
          local_7f0._0_4_ = pnVar40[iVar26].m_backend.fpclass;
          local_7f0._4_4_ = pnVar40[iVar26].m_backend.prec_elem;
          x_1.m_backend.fpclass = cpp_dec_float_finite;
          x_1.m_backend.prec_elem = 0x10;
          x_1.m_backend.data._M_elems[0] = 0;
          x_1.m_backend.data._M_elems[1] = 0;
          x_1.m_backend.data._M_elems[2] = 0;
          x_1.m_backend.data._M_elems[3] = 0;
          x_1.m_backend.data._M_elems[4] = 0;
          x_1.m_backend.data._M_elems[5] = 0;
          x_1.m_backend.data._M_elems[6] = 0;
          x_1.m_backend.data._M_elems[7] = 0;
          x_1.m_backend.data._M_elems[8] = 0;
          x_1.m_backend.data._M_elems[9] = 0;
          x_1.m_backend.data._M_elems[10] = 0;
          x_1.m_backend.data._M_elems[0xb] = 0;
          x_1.m_backend.data._M_elems[0xc] = 0;
          x_1.m_backend.data._M_elems[0xd] = 0;
          x_1.m_backend.data._M_elems._56_5_ = 0;
          x_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          x_1.m_backend.exp = 0;
          x_1.m_backend.neg = false;
          if (&x_1.m_backend == &local_750[iVar26].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&x_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_838);
            if (x_1.m_backend.data._M_elems[0] != 0 || x_1.m_backend.fpclass != cpp_dec_float_finite
               ) {
              x_1.m_backend.neg = (bool)(x_1.m_backend.neg ^ 1);
            }
          }
          else {
            x_1.m_backend.prec_elem = local_7f0._4_4_;
            x_1.m_backend.fpclass = (fpclass_type)local_7f0;
            x_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar41->m_backend).data._M_elems;
            x_1.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((pnVar41->m_backend).data._M_elems + 2);
            x_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar36;
            x_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar36 + 2);
            x_1.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            x_1.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            x_1.m_backend.data._M_elems._48_8_ = local_808._0_8_;
            x_1.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff800;
            x_1.m_backend.data._M_elems[0xf]._1_3_ = uStack_7fb;
            x_1.m_backend.exp = iStack_7f8;
            x_1.m_backend.neg = bStack_7f4;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&x_1.m_backend,&local_750[iVar26].m_backend);
          }
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x10;
          lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&lowstab.m_backend,&x_1.m_backend,&x.m_backend);
          local_818._12_4_ = lowstab.m_backend.data._M_elems[0xb];
          local_818._8_4_ = lowstab.m_backend.data._M_elems[10];
          local_808[1] = lowstab.m_backend.data._M_elems[0xd];
          local_808[0] = lowstab.m_backend.data._M_elems[0xc];
          stack0xfffffffffffff800 =
               (undefined5)
               CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]);
          uStack_7fb = (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
          local_818._0_4_ = lowstab.m_backend.data._M_elems[8];
          local_818._4_4_ = lowstab.m_backend.data._M_elems[9];
          local_828._0_4_ = lowstab.m_backend.data._M_elems[4];
          local_828._4_4_ = lowstab.m_backend.data._M_elems[5];
          local_828._8_4_ = lowstab.m_backend.data._M_elems[6];
          local_828._12_4_ = lowstab.m_backend.data._M_elems[7];
          local_838._0_4_ = lowstab.m_backend.data._M_elems[0];
          local_838._4_4_ = lowstab.m_backend.data._M_elems[1];
          local_838._8_4_ = lowstab.m_backend.data._M_elems[2];
          local_838._12_4_ = lowstab.m_backend.data._M_elems[3];
          iStack_7f8 = lowstab.m_backend.exp;
          bStack_7f4 = lowstab.m_backend.neg;
          uVar13._0_4_ = lowstab.m_backend.fpclass;
          uVar13._4_4_ = lowstab.m_backend.prec_elem;
          local_7f0._0_4_ = lowstab.m_backend.fpclass;
          local_7f0._4_4_ = lowstab.m_backend.prec_elem;
          if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
              (uVar13 = local_7f0, (fpclass_type)local_700 != cpp_dec_float_NaN)) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_838,
                                  (cpp_dec_float<100U,_int,_void> *)local_748), uVar13 = local_7f0,
             iVar26 < 1)) {
            local_6e8.neg = x.m_backend.neg;
            if (x.m_backend.neg == true) {
              local_6e8.neg =
                   x.m_backend.fpclass == cpp_dec_float_finite && x.m_backend.data._M_elems[0] == 0;
            }
            local_6e8.data._M_elems[0] = x.m_backend.data._M_elems[0];
            pnVar41 = &x;
            local_6e8.exp = x.m_backend.exp;
            local_6e8._72_8_ = x.m_backend._72_8_;
LAB_00491f64:
            puVar36 = (pnVar41->m_backend).data._M_elems + 1;
            local_6e8.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)(puVar36 + 0xb) >> 0x20);
            local_6e8.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar36 + 0xd),0);
            local_6e8.data._M_elems[0xf]._1_3_ =
                 (undefined3)((ulong)*(undefined8 *)(puVar36 + 0xd) >> 0x28);
            local_6e8.data._M_elems[9] = (uint)*(undefined8 *)(puVar36 + 8);
            local_6e8.data._M_elems[10] = (uint)((ulong)*(undefined8 *)(puVar36 + 8) >> 0x20);
            local_6e8.data._M_elems[0xb] = (uint)*(undefined8 *)(puVar36 + 10);
            local_6e8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)(puVar36 + 10) >> 0x20);
            local_6e8.data._M_elems[5] = (uint)*(undefined8 *)(puVar36 + 4);
            local_6e8.data._M_elems[6] = (uint)((ulong)*(undefined8 *)(puVar36 + 4) >> 0x20);
            local_6e8.data._M_elems[7] = (uint)*(undefined8 *)(puVar36 + 6);
            local_6e8.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(puVar36 + 6) >> 0x20);
            local_6e8.data._M_elems[1] = (uint)*(undefined8 *)puVar36;
            local_6e8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar36 >> 0x20);
            local_6e8.data._M_elems[3] = (uint)*(undefined8 *)(puVar36 + 2);
            local_6e8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar36 + 2) >> 0x20);
            local_89c = (uint)lVar44;
            uVar13 = local_7f0;
          }
        }
        goto LAB_00491c2f;
      }
      pBVar7[lVar44].idx = -1;
      pUVar39 = pSVar5->theCoPvec;
LAB_004914e3:
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar39->thedelta,iVar26);
      bVar46 = false;
    }
    lVar33 = lVar44;
  } while (!bVar46);
  local_648 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems[6] = 0;
  lowstab.m_backend.data._M_elems[7] = 0;
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&lowstab.m_backend,local_648,&local_6e8);
  pnVar1 = local_7e8;
  bVar22 = lowstab.m_backend.neg;
  iVar26 = lowstab.m_backend.exp;
  uVar30 = lowstab.m_backend.data._M_elems._32_8_;
  uVar35 = lowstab.m_backend.data._M_elems._0_8_;
  uVar32 = lowstab.m_backend.data._M_elems._8_8_;
  uVar13 = lowstab.m_backend.data._M_elems._16_8_;
  uVar31 = lowstab.m_backend.data._M_elems._24_8_;
  uVar14._4_4_ = lowstab.m_backend.data._M_elems[0xb];
  uVar14._0_4_ = lowstab.m_backend.data._M_elems[10];
  uVar15._4_4_ = lowstab.m_backend.data._M_elems[0xd];
  uVar15._0_4_ = lowstab.m_backend.data._M_elems[0xc];
  uVar16._4_4_ = lowstab.m_backend.data._M_elems[0xf];
  uVar16._0_4_ = lowstab.m_backend.data._M_elems[0xe];
  fVar23 = lowstab.m_backend.fpclass;
  iVar24 = lowstab.m_backend.prec_elem;
  bVar46 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableLeave;
  peVar10 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar4 = peVar10->s_epsilon_multiplier;
  uVar47 = -(ulong)(dVar4 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x10;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&lowstab,
             (double)(~uVar47 & (ulong)(dVar4 * 1e-10) | uVar47 & 0x3ddb7cdfd9d7bdbb));
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (bVar46 == false) {
    local_88.m_backend.data._M_elems[1] = local_6e8.data._M_elems[1];
    local_88.m_backend.data._M_elems[0] = local_6e8.data._M_elems[0];
    local_88.m_backend.data._M_elems[3] = local_6e8.data._M_elems[3];
    local_88.m_backend.data._M_elems[2] = local_6e8.data._M_elems[2];
    local_88.m_backend.data._M_elems[5] = local_6e8.data._M_elems[5];
    local_88.m_backend.data._M_elems[4] = local_6e8.data._M_elems[4];
    local_88.m_backend.data._M_elems[7] = local_6e8.data._M_elems[7];
    local_88.m_backend.data._M_elems[6] = local_6e8.data._M_elems[6];
    local_88.m_backend.data._M_elems[9] = local_6e8.data._M_elems[9];
    local_88.m_backend.data._M_elems[8] = local_6e8.data._M_elems[8];
    local_88.m_backend.data._M_elems[0xb] = local_6e8.data._M_elems[0xb];
    local_88.m_backend.data._M_elems[10] = local_6e8.data._M_elems[10];
    local_88.m_backend.data._M_elems[0xd] = local_6e8.data._M_elems[0xd];
    local_88.m_backend.data._M_elems[0xc] = local_6e8.data._M_elems[0xc];
    local_88.m_backend.data._M_elems[0xf]._1_3_ = local_6e8.data._M_elems[0xf]._1_3_;
    local_88.m_backend.data._M_elems._56_5_ = local_6e8.data._M_elems._56_5_;
    local_88.m_backend.exp = local_6e8.exp;
    local_88.m_backend.neg = local_6e8.neg;
    local_88.m_backend.fpclass = local_6e8.fpclass;
    local_88.m_backend.prec_elem = local_6e8.prec_elem;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&x,&this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_88);
  }
  else {
    x.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
    x.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
    x.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
    x.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
    x.m_backend.data._M_elems._56_5_ =
         SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]),0
              );
    x.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
    x.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    x.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
    x.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    x.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    x.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    x.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
    x.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    x.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    x.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    x.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    x.m_backend.exp = lowstab.m_backend.exp;
    x.m_backend.neg = lowstab.m_backend.neg;
    x.m_backend.fpclass = lowstab.m_backend.fpclass;
    x.m_backend.prec_elem = lowstab.m_backend.prec_elem;
  }
  auVar25 = (undefined1  [16])x.m_backend.data._M_elems._32_16_;
  auVar20 = (undefined1  [16])x.m_backend.data._M_elems._16_16_;
  auVar17 = (undefined1  [16])x.m_backend.data._M_elems._0_16_;
  local_698.data._M_elems[0xc] = x.m_backend.data._M_elems[0xc];
  local_698.data._M_elems[0xd] = x.m_backend.data._M_elems[0xd];
  local_698.data._M_elems._56_5_ = x.m_backend.data._M_elems._56_5_;
  local_698.data._M_elems[0xf]._1_3_ = x.m_backend.data._M_elems[0xf]._1_3_;
  local_698.data._M_elems[8] = x.m_backend.data._M_elems[8];
  local_698.data._M_elems[9] = x.m_backend.data._M_elems[9];
  local_698.data._M_elems[10] = x.m_backend.data._M_elems[10];
  local_698.data._M_elems[0xb] = x.m_backend.data._M_elems[0xb];
  local_698.data._M_elems[4] = x.m_backend.data._M_elems[4];
  local_698.data._M_elems[5] = x.m_backend.data._M_elems[5];
  local_698.data._M_elems[6] = x.m_backend.data._M_elems[6];
  local_698.data._M_elems[7] = x.m_backend.data._M_elems[7];
  local_698.data._M_elems[0] = x.m_backend.data._M_elems[0];
  local_698.data._M_elems[1] = x.m_backend.data._M_elems[1];
  local_698.data._M_elems[2] = x.m_backend.data._M_elems[2];
  local_698.data._M_elems[3] = x.m_backend.data._M_elems[3];
  local_698.exp = x.m_backend.exp;
  local_698.neg = x.m_backend.neg;
  local_698.fpclass = x.m_backend.fpclass;
  local_698.prec_elem = x.m_backend.prec_elem;
  x.m_backend.data._M_elems._0_16_ = auVar17;
  x.m_backend.data._M_elems._16_16_ = auVar20;
  x.m_backend.data._M_elems._32_16_ = auVar25;
  if ((int)local_89c < 0) {
    bVar46 = false;
    uVar28 = local_910;
    if (-1 < (int)local_910) {
      do {
        uVar21 = lowstab.m_backend.data._M_elems._32_8_;
        auVar20 = (undefined1  [16])lowstab.m_backend.data._M_elems._16_16_;
        auVar17 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar27 = pBVar7[local_910].idx;
        if (-1 < iVar27) {
          bVar46 = pBVar7[local_910].src == PVEC;
          if (bVar46) {
            local_2f8.m_backend.data._M_elems[0xf]._1_3_ = local_698.data._M_elems[0xf]._1_3_;
            local_2f8.m_backend.data._M_elems._56_5_ = local_698.data._M_elems._56_5_;
            local_2f8.m_backend.data._M_elems[0xc] = local_698.data._M_elems[0xc];
            local_2f8.m_backend.data._M_elems[0xd] = local_698.data._M_elems[0xd];
            local_2f8.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
            local_2f8.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
            local_2f8.m_backend.data._M_elems[10] = local_698.data._M_elems[10];
            local_2f8.m_backend.data._M_elems[0xb] = local_698.data._M_elems[0xb];
            local_2f8.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
            local_2f8.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
            local_2f8.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
            local_2f8.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
            local_2f8.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
            local_2f8.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
            local_2f8.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
            local_2f8.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
            local_2f8.m_backend.exp = local_698.exp;
            local_2f8.m_backend.neg = local_698.neg;
            local_2f8.m_backend.fpclass = local_698.fpclass;
            local_2f8.m_backend.prec_elem = local_698.prec_elem;
            lowstab.m_backend.data._M_elems[0] = (uint)uVar35;
            lowstab.m_backend.data._M_elems[1] = SUB84(uVar35,4);
            local_438.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
            local_438.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
            lowstab.m_backend.data._M_elems[2] = (uint)uVar32;
            lowstab.m_backend.data._M_elems[3] = SUB84(uVar32,4);
            local_438.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
            local_438.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[4] = (uint)uVar13;
            lowstab.m_backend.data._M_elems[5] = SUB84(uVar13,4);
            local_438.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
            local_438.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
            lowstab.m_backend.data._M_elems[6] = (uint)uVar31;
            lowstab.m_backend.data._M_elems[7] = SUB84(uVar31,4);
            local_438.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
            local_438.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
            lowstab.m_backend.data._M_elems[8] = (uint)uVar30;
            lowstab.m_backend.data._M_elems[9] = SUB84(uVar30,4);
            local_438.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
            local_438.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
            local_438.m_backend.exp = iVar26;
            local_438.m_backend.neg = bVar22;
            local_438.m_backend.fpclass = fVar23;
            local_438.m_backend.prec_elem = iVar24;
            local_348.m_backend.data._M_elems[0] = local_7b8.data._M_elems[0];
            local_348.m_backend.data._M_elems[1] = local_7b8.data._M_elems[1];
            local_348.m_backend.data._M_elems[2] = local_7b8.data._M_elems[2];
            local_348.m_backend.data._M_elems[3] = local_7b8.data._M_elems[3];
            local_348.m_backend.data._M_elems[4] = local_7b8.data._M_elems[4];
            local_348.m_backend.data._M_elems[5] = local_7b8.data._M_elems[5];
            local_348.m_backend.data._M_elems[6] = local_7b8.data._M_elems[6];
            local_348.m_backend.data._M_elems[7] = local_7b8.data._M_elems[7];
            local_348.m_backend.data._M_elems[8] = local_7b8.data._M_elems[8];
            local_348.m_backend.data._M_elems[9] = local_7b8.data._M_elems[9];
            local_348.m_backend.data._M_elems[10] = local_7b8.data._M_elems[10];
            local_348.m_backend.data._M_elems[0xb] = local_7b8.data._M_elems[0xb];
            local_348.m_backend.data._M_elems[0xc] = local_7b8.data._M_elems[0xc];
            local_348.m_backend.data._M_elems[0xd] = local_7b8.data._M_elems[0xd];
            local_348.m_backend.data._M_elems[0xe] = local_7b8.data._M_elems[0xe];
            local_348.m_backend.data._M_elems[0xf] = local_7b8.data._M_elems[0xf];
            local_348.m_backend.exp = local_7b8.exp;
            local_348.m_backend.neg = local_7b8.neg;
            local_348.m_backend.fpclass = local_7b8.fpclass;
            local_348.m_backend.prec_elem = local_7b8.prec_elem;
            pnVar41 = &local_2f8;
            pnVar42 = &local_438;
            pnVar51 = &local_348;
            pnVar40 = local_7d0;
            pnVar48 = local_760;
            pnVar49 = local_7e0;
            pnVar50 = local_768;
            local_438.m_backend.data._M_elems._40_8_ = uVar14;
            local_438.m_backend.data._M_elems._48_8_ = uVar15;
            local_438.m_backend.data._M_elems._56_8_ = uVar16;
          }
          else {
            local_398.m_backend.data._M_elems[0xf]._1_3_ = local_698.data._M_elems[0xf]._1_3_;
            local_398.m_backend.data._M_elems._56_5_ = local_698.data._M_elems._56_5_;
            local_398.m_backend.data._M_elems[0xc] = local_698.data._M_elems[0xc];
            local_398.m_backend.data._M_elems[0xd] = local_698.data._M_elems[0xd];
            local_398.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
            local_398.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
            local_398.m_backend.data._M_elems[10] = local_698.data._M_elems[10];
            local_398.m_backend.data._M_elems[0xb] = local_698.data._M_elems[0xb];
            local_398.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
            local_398.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
            local_398.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
            local_398.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
            local_398.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
            local_398.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
            local_398.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
            local_398.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
            local_398.m_backend.exp = local_698.exp;
            local_398.m_backend.neg = local_698.neg;
            local_398.m_backend.fpclass = local_698.fpclass;
            local_398.m_backend.prec_elem = local_698.prec_elem;
            lowstab.m_backend.data._M_elems[0] = (uint)uVar35;
            lowstab.m_backend.data._M_elems[1] = SUB84(uVar35,4);
            local_488.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
            local_488.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
            lowstab.m_backend.data._M_elems[2] = (uint)uVar32;
            lowstab.m_backend.data._M_elems[3] = SUB84(uVar32,4);
            local_488.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
            local_488.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[4] = (uint)uVar13;
            lowstab.m_backend.data._M_elems[5] = SUB84(uVar13,4);
            local_488.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
            local_488.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
            lowstab.m_backend.data._M_elems[6] = (uint)uVar31;
            lowstab.m_backend.data._M_elems[7] = SUB84(uVar31,4);
            local_488.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
            local_488.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
            lowstab.m_backend.data._M_elems[8] = (uint)uVar30;
            lowstab.m_backend.data._M_elems[9] = SUB84(uVar30,4);
            local_488.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
            local_488.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
            local_488.m_backend.exp = iVar26;
            local_488.m_backend.neg = bVar22;
            local_488.m_backend.fpclass = fVar23;
            local_488.m_backend.prec_elem = iVar24;
            local_3e8.m_backend.data._M_elems[0] = local_7b8.data._M_elems[0];
            local_3e8.m_backend.data._M_elems[1] = local_7b8.data._M_elems[1];
            local_3e8.m_backend.data._M_elems[2] = local_7b8.data._M_elems[2];
            local_3e8.m_backend.data._M_elems[3] = local_7b8.data._M_elems[3];
            local_3e8.m_backend.data._M_elems[4] = local_7b8.data._M_elems[4];
            local_3e8.m_backend.data._M_elems[5] = local_7b8.data._M_elems[5];
            local_3e8.m_backend.data._M_elems[6] = local_7b8.data._M_elems[6];
            local_3e8.m_backend.data._M_elems[7] = local_7b8.data._M_elems[7];
            local_3e8.m_backend.data._M_elems[8] = local_7b8.data._M_elems[8];
            local_3e8.m_backend.data._M_elems[9] = local_7b8.data._M_elems[9];
            local_3e8.m_backend.data._M_elems[10] = local_7b8.data._M_elems[10];
            local_3e8.m_backend.data._M_elems[0xb] = local_7b8.data._M_elems[0xb];
            local_3e8.m_backend.data._M_elems[0xc] = local_7b8.data._M_elems[0xc];
            local_3e8.m_backend.data._M_elems[0xd] = local_7b8.data._M_elems[0xd];
            local_3e8.m_backend.data._M_elems[0xe] = local_7b8.data._M_elems[0xe];
            local_3e8.m_backend.data._M_elems[0xf] = local_7b8.data._M_elems[0xf];
            local_3e8.m_backend.exp = local_7b8.exp;
            local_3e8.m_backend.neg = local_7b8.neg;
            local_3e8.m_backend.fpclass = local_7b8.fpclass;
            local_3e8.m_backend.prec_elem = local_7b8.prec_elem;
            pnVar41 = &local_398;
            pnVar42 = &local_488;
            pnVar51 = &local_3e8;
            pnVar40 = local_7c8;
            pnVar48 = local_750;
            pnVar49 = local_7d8;
            pnVar50 = local_758;
            local_488.m_backend.data._M_elems._40_8_ = uVar14;
            local_488.m_backend.data._M_elems._48_8_ = uVar15;
            local_488.m_backend.data._M_elems._56_8_ = uVar16;
          }
          lowstab.m_backend.data._M_elems._0_16_ = auVar17;
          lowstab.m_backend.data._M_elems._16_16_ = auVar20;
          lowstab.m_backend.data._M_elems._32_8_ = uVar21;
          bVar46 = getData(this,pnVar1,&enterId,iVar27,pnVar41,pnVar42,pnVar40,pnVar48,pnVar49,
                           pnVar50,(uint)!bVar46,pnVar51);
        }
        uVar28 = local_910 - 1;
      } while ((bVar46 == false) && (bVar12 = 0 < (int)local_910, local_910 = uVar28, bVar12));
    }
    local_910 = uVar28 + 1;
  }
  else {
    if ((x.m_backend.fpclass == cpp_dec_float_NaN || local_6e8.fpclass == cpp_dec_float_NaN) ||
       (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_6e8,&local_698), uVar21 = lowstab.m_backend.data._M_elems._32_8_,
       auVar20 = (undefined1  [16])lowstab.m_backend.data._M_elems._16_16_,
       auVar17 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_, iVar27 < 1))
    goto LAB_00492ad5;
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar46 = pBVar7[local_89c].src == PVEC;
    if (bVar46) {
      local_d8.m_backend.data._M_elems[0xf]._1_3_ = local_698.data._M_elems[0xf]._1_3_;
      local_d8.m_backend.data._M_elems._56_5_ = local_698.data._M_elems._56_5_;
      pnVar41 = &local_d8;
      local_d8.m_backend.data._M_elems[0xc] = local_698.data._M_elems[0xc];
      local_d8.m_backend.data._M_elems[0xd] = local_698.data._M_elems[0xd];
      local_d8.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
      local_d8.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
      local_d8.m_backend.data._M_elems[10] = local_698.data._M_elems[10];
      local_d8.m_backend.data._M_elems[0xb] = local_698.data._M_elems[0xb];
      local_d8.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
      local_d8.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
      local_d8.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
      local_d8.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
      local_d8.m_backend.exp = local_698.exp;
      local_d8.m_backend.neg = local_698.neg;
      local_d8.m_backend.fpclass = local_698.fpclass;
      local_d8.m_backend.prec_elem = local_698.prec_elem;
      pnVar42 = &local_128;
      lowstab.m_backend.data._M_elems[0] = (uint)uVar35;
      lowstab.m_backend.data._M_elems[1] = SUB84(uVar35,4);
      local_128.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
      local_128.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
      lowstab.m_backend.data._M_elems[2] = (uint)uVar32;
      lowstab.m_backend.data._M_elems[3] = SUB84(uVar32,4);
      local_128.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
      local_128.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
      lowstab.m_backend.data._M_elems[4] = (uint)uVar13;
      lowstab.m_backend.data._M_elems[5] = SUB84(uVar13,4);
      local_128.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      local_128.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      lowstab.m_backend.data._M_elems[6] = (uint)uVar31;
      lowstab.m_backend.data._M_elems[7] = SUB84(uVar31,4);
      local_128.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
      local_128.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
      lowstab.m_backend.data._M_elems[8] = (uint)uVar30;
      lowstab.m_backend.data._M_elems[9] = SUB84(uVar30,4);
      local_128.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
      local_128.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
      local_128.m_backend.exp = iVar26;
      local_128.m_backend.neg = bVar22;
      local_128.m_backend.fpclass = fVar23;
      local_128.m_backend.prec_elem = iVar24;
      pnVar51 = &local_178;
      local_178.m_backend.data._M_elems[0] = local_7b8.data._M_elems[0];
      local_178.m_backend.data._M_elems[1] = local_7b8.data._M_elems[1];
      local_178.m_backend.data._M_elems[2] = local_7b8.data._M_elems[2];
      local_178.m_backend.data._M_elems[3] = local_7b8.data._M_elems[3];
      local_178.m_backend.data._M_elems[4] = local_7b8.data._M_elems[4];
      local_178.m_backend.data._M_elems[5] = local_7b8.data._M_elems[5];
      local_178.m_backend.data._M_elems[6] = local_7b8.data._M_elems[6];
      local_178.m_backend.data._M_elems[7] = local_7b8.data._M_elems[7];
      local_178.m_backend.data._M_elems[8] = local_7b8.data._M_elems[8];
      local_178.m_backend.data._M_elems[9] = local_7b8.data._M_elems[9];
      local_178.m_backend.data._M_elems[10] = local_7b8.data._M_elems[10];
      local_178.m_backend.data._M_elems[0xb] = local_7b8.data._M_elems[0xb];
      local_178.m_backend.data._M_elems[0xc] = local_7b8.data._M_elems[0xc];
      local_178.m_backend.data._M_elems[0xd] = local_7b8.data._M_elems[0xd];
      local_178.m_backend.data._M_elems[0xe] = local_7b8.data._M_elems[0xe];
      local_178.m_backend.data._M_elems[0xf] = local_7b8.data._M_elems[0xf];
      local_178.m_backend.exp = local_7b8.exp;
      local_178.m_backend.neg = local_7b8.neg;
      local_178.m_backend.fpclass = local_7b8.fpclass;
      local_178.m_backend.prec_elem = local_7b8.prec_elem;
      pnVar40 = local_7d0;
      pnVar48 = local_760;
      pnVar49 = local_7e0;
      pnVar50 = local_768;
      local_128.m_backend.data._M_elems._40_8_ = uVar14;
      local_128.m_backend.data._M_elems._48_8_ = uVar15;
      local_128.m_backend.data._M_elems._56_8_ = uVar16;
    }
    else {
      local_1c8.m_backend.data._M_elems[0xf]._1_3_ = local_698.data._M_elems[0xf]._1_3_;
      local_1c8.m_backend.data._M_elems._56_5_ = local_698.data._M_elems._56_5_;
      pnVar41 = &local_1c8;
      local_1c8.m_backend.data._M_elems[0xc] = local_698.data._M_elems[0xc];
      local_1c8.m_backend.data._M_elems[0xd] = local_698.data._M_elems[0xd];
      local_1c8.m_backend.data._M_elems[8] = local_698.data._M_elems[8];
      local_1c8.m_backend.data._M_elems[9] = local_698.data._M_elems[9];
      local_1c8.m_backend.data._M_elems[10] = local_698.data._M_elems[10];
      local_1c8.m_backend.data._M_elems[0xb] = local_698.data._M_elems[0xb];
      local_1c8.m_backend.data._M_elems[4] = local_698.data._M_elems[4];
      local_1c8.m_backend.data._M_elems[5] = local_698.data._M_elems[5];
      local_1c8.m_backend.data._M_elems[6] = local_698.data._M_elems[6];
      local_1c8.m_backend.data._M_elems[7] = local_698.data._M_elems[7];
      local_1c8.m_backend.data._M_elems[0] = local_698.data._M_elems[0];
      local_1c8.m_backend.data._M_elems[1] = local_698.data._M_elems[1];
      local_1c8.m_backend.data._M_elems[2] = local_698.data._M_elems[2];
      local_1c8.m_backend.data._M_elems[3] = local_698.data._M_elems[3];
      local_1c8.m_backend.exp = local_698.exp;
      local_1c8.m_backend.neg = local_698.neg;
      local_1c8.m_backend.fpclass = local_698.fpclass;
      local_1c8.m_backend.prec_elem = local_698.prec_elem;
      pnVar42 = &local_218;
      lowstab.m_backend.data._M_elems[0] = (uint)uVar35;
      lowstab.m_backend.data._M_elems[1] = SUB84(uVar35,4);
      local_218.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
      lowstab.m_backend.data._M_elems[2] = (uint)uVar32;
      lowstab.m_backend.data._M_elems[3] = SUB84(uVar32,4);
      local_218.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
      lowstab.m_backend.data._M_elems[4] = (uint)uVar13;
      lowstab.m_backend.data._M_elems[5] = SUB84(uVar13,4);
      local_218.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      lowstab.m_backend.data._M_elems[6] = (uint)uVar31;
      lowstab.m_backend.data._M_elems[7] = SUB84(uVar31,4);
      local_218.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
      lowstab.m_backend.data._M_elems[8] = (uint)uVar30;
      lowstab.m_backend.data._M_elems[9] = SUB84(uVar30,4);
      local_218.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
      local_218.m_backend.exp = iVar26;
      local_218.m_backend.neg = bVar22;
      local_218.m_backend.fpclass = fVar23;
      local_218.m_backend.prec_elem = iVar24;
      pnVar51 = &local_268;
      local_268.m_backend.data._M_elems[0] = local_7b8.data._M_elems[0];
      local_268.m_backend.data._M_elems[1] = local_7b8.data._M_elems[1];
      local_268.m_backend.data._M_elems[2] = local_7b8.data._M_elems[2];
      local_268.m_backend.data._M_elems[3] = local_7b8.data._M_elems[3];
      local_268.m_backend.data._M_elems[4] = local_7b8.data._M_elems[4];
      local_268.m_backend.data._M_elems[5] = local_7b8.data._M_elems[5];
      local_268.m_backend.data._M_elems[6] = local_7b8.data._M_elems[6];
      local_268.m_backend.data._M_elems[7] = local_7b8.data._M_elems[7];
      local_268.m_backend.data._M_elems[8] = local_7b8.data._M_elems[8];
      local_268.m_backend.data._M_elems[9] = local_7b8.data._M_elems[9];
      local_268.m_backend.data._M_elems[10] = local_7b8.data._M_elems[10];
      local_268.m_backend.data._M_elems[0xb] = local_7b8.data._M_elems[0xb];
      local_268.m_backend.data._M_elems[0xc] = local_7b8.data._M_elems[0xc];
      local_268.m_backend.data._M_elems[0xd] = local_7b8.data._M_elems[0xd];
      local_268.m_backend.data._M_elems[0xe] = local_7b8.data._M_elems[0xe];
      local_268.m_backend.data._M_elems[0xf] = local_7b8.data._M_elems[0xf];
      local_268.m_backend.exp = local_7b8.exp;
      local_268.m_backend.neg = local_7b8.neg;
      local_268.m_backend.fpclass = local_7b8.fpclass;
      local_268.m_backend.prec_elem = local_7b8.prec_elem;
      pnVar40 = local_7c8;
      pnVar48 = local_750;
      pnVar49 = local_7d8;
      pnVar50 = local_758;
      local_218.m_backend.data._M_elems._40_8_ = uVar14;
      local_218.m_backend.data._M_elems._48_8_ = uVar15;
      local_218.m_backend.data._M_elems._56_8_ = uVar16;
    }
    lowstab.m_backend.data._M_elems._0_16_ = auVar17;
    lowstab.m_backend.data._M_elems._16_16_ = auVar20;
    lowstab.m_backend.data._M_elems._32_8_ = uVar21;
    bVar46 = getData(this,pnVar1,&enterId,pBVar7[local_89c].idx,pnVar41,pnVar42,pnVar40,pnVar48,
                     pnVar49,pnVar50,(uint)!bVar46,pnVar51);
  }
  if (bVar46 == false) {
LAB_00492ad5:
    if (this->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      this->relax_count = this->relax_count + 1;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 0xc) = local_7b8.data._M_elems._48_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 0xe) = local_7b8.data._M_elems._56_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) = local_7b8.data._M_elems._32_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 10) = local_7b8.data._M_elems._40_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_7b8.data._M_elems._16_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 6) = local_7b8.data._M_elems._24_8_;
      *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_7b8.data._M_elems._0_8_;
      *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_7b8.data._M_elems._8_8_;
      (pnVar1->m_backend).exp = local_7b8.exp;
      (pnVar1->m_backend).neg = local_7b8.neg;
      (pnVar1->m_backend).fpclass = local_7b8.fpclass;
      (pnVar1->m_backend).prec_elem = local_7b8.prec_elem;
      enterId = selectEnter(this,pnVar1,leaveIdx,false);
    }
    return (SPxId)enterId.super_DataKey;
  }
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  lVar33 = (long)(int)local_910;
  if (0 < lVar33) {
    pBVar11 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar7 = pBVar11 + lVar33;
    local_2a8 = *(undefined8 *)&(pBVar7->val).m_backend.data;
    uStack_2a0 = *(undefined8 *)((long)&(pBVar7->val).m_backend.data + 8);
    auVar17 = *(undefined1 (*) [16])&(pBVar7->val).m_backend;
    x.m_backend.data._M_elems._8_8_ = auVar17._8_8_;
    puVar36 = (uint *)((long)&pBVar11[lVar33].val.m_backend + 0x10);
    local_298 = *(undefined8 *)puVar36;
    uStack_290 = *(undefined8 *)(puVar36 + 2);
    x.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar36;
    puVar36 = (uint *)((long)&pBVar11[lVar33].val.m_backend + 0x20);
    local_288 = *(undefined8 *)puVar36;
    uStack_280 = *(undefined8 *)(puVar36 + 2);
    x.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])puVar36;
    puVar36 = (uint *)((long)&pBVar11[lVar33].val.m_backend + 0x30);
    x.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar36;
    uStack_270 = *(undefined8 *)(puVar36 + 2);
    x.m_backend.exp = *(int *)((long)&pBVar11[lVar33].val.m_backend + 0x40);
    x.m_backend.neg = *(bool *)((long)&pBVar11[lVar33].val.m_backend + 0x44);
    x.m_backend._72_8_ = *(undefined8 *)((long)&pBVar11[lVar33].val.m_backend + 0x48);
    x.m_backend.data._M_elems._56_5_ = SUB85(uStack_270,0);
    x.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uStack_270 >> 0x28);
    if ((x.m_backend.neg == true) &&
       (x.m_backend.data._M_elems[0] = (uint)local_2a8,
       x.m_backend.data._M_elems[0] != 0 || x.m_backend.fpclass != cpp_dec_float_finite)) {
      x.m_backend.neg = false;
    }
    local_278 = (uint  [2])x.m_backend.data._M_elems._48_8_;
    if ((x.m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) {
      x.m_backend.data._M_elems._0_16_ = auVar17;
      iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&x.m_backend,local_648);
      if (0 < iVar26) {
        flipAndUpdate(this,(int *)&local_910);
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = local_910;
        if (9 < (int)local_910) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_6f0,1);
          uVar31._0_4_ = enterId.super_DataKey.info;
          uVar31._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar31;
        }
        uVar35 = 0x3fa999999999999a;
        goto LAB_00492b79;
      }
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  uVar35 = 0x3fb999999999999a;
LAB_00492b79:
  x.m_backend.data._M_elems[0] = (int)uVar35;
  x.m_backend.data._M_elems[1] = (int)((ulong)uVar35 >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)local_6f0,(double *)&x);
  uVar30._0_4_ = enterId.super_DataKey.info;
  uVar30._4_4_ = enterId.super_DataKey.idx;
  return (SPxId)uVar30;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}